

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Array<double,_4> * __thiscall
tcu::Matrix<double,_2,_2>::getColumnMajorData
          (Array<double,_4> *__return_storage_ptr__,Matrix<double,_2,_2> *this)

{
  double *pdVar1;
  int local_3c;
  int local_38;
  int row;
  int col;
  double *local_28;
  double *dst;
  Matrix<double,_2,_2> *this_local;
  Array<double,_4> *a;
  
  Array<double,_4>::Array(__return_storage_ptr__);
  local_28 = Array<double,_4>::getPtr(__return_storage_ptr__);
  for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
      pdVar1 = operator()(this,local_3c,local_38);
      *local_28 = *pdVar1;
      local_28 = local_28 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Array<T, Rows*Cols> Matrix<T, Rows, Cols>::getColumnMajorData (void) const
{
	Array<T, Rows*Cols> a;
	T* dst = a.getPtr();
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			*dst++ = (*this)(row, col);
	return a;
}